

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool place_new_monster(chunk *c,loc_conflict grid,monster_race *race,_Bool sleep,_Bool group_ok,
                       monster_group_info group_info,uint8_t origin)

{
  monster_group_info mVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  monster_race *friends_race_00;
  monster_race *friends_race;
  monster_friends_base *pmStack_40;
  wchar_t total;
  monster_friends_base *friends_base;
  monster_friends *friends;
  uint8_t origin_local;
  _Bool group_ok_local;
  _Bool sleep_local;
  monster_race *race_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x865,
                  "_Bool place_new_monster(struct chunk *, struct loc, struct monster_race *, _Bool, _Bool, struct monster_group_info, uint8_t)"
                 );
  }
  if (race == (monster_race *)0x0) {
    __assert_fail("race",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x866,
                  "_Bool place_new_monster(struct chunk *, struct loc, struct monster_race *, _Bool, _Bool, struct monster_group_info, uint8_t)"
                 );
  }
  if (group_info.index == L'\0') {
    wVar3 = monster_group_index_new(c);
    group_info.index = wVar3;
  }
  mVar1 = group_info;
  _Var2 = place_new_monster_one(c,grid,race,sleep,group_info,origin);
  if (_Var2) {
    if (group_ok) {
      friends_base = (monster_friends_base *)race->friends;
      while( true ) {
        group_info.index = mVar1.index;
        group_info.player_race = mVar1.player_race;
        if (friends_base == (monster_friends_base *)0x0) break;
        uVar4 = Rand_div(100);
        if (uVar4 < friends_base->number_side) {
          wVar3 = damroll(*(int *)&friends_base[1].next,*(int *)((long)&friends_base[1].next + 4));
          group_info.role = friends_base->number_dice;
          place_friends(c,grid,race,*(monster_race **)&friends_base->role,wVar3,sleep,group_info,
                        origin);
        }
        friends_base = friends_base->next;
      }
      for (pmStack_40 = race->friends_base; pmStack_40 != (monster_friends_base *)0x0;
          pmStack_40 = pmStack_40->next) {
        uVar4 = Rand_div(100);
        if (uVar4 < pmStack_40->percent_chance) {
          wVar3 = damroll(pmStack_40->number_dice,pmStack_40->number_side);
          place_monster_base = pmStack_40->base;
          get_mon_num_prep(place_monster_base_okay);
          friends_race_00 = get_mon_num(race->level,c->depth);
          get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
          if (friends_race_00 == (monster_race *)0x0) break;
          group_info.role = pmStack_40->role;
          place_friends(c,grid,race,friends_race_00,wVar3,sleep,group_info,origin);
        }
      }
      grid_local.x._3_1_ = true;
    }
    else {
      grid_local.x._3_1_ = true;
    }
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

bool place_new_monster(struct chunk *c, struct loc grid,
		struct monster_race *race, bool sleep, bool group_ok,
		struct monster_group_info group_info, uint8_t origin)
{
	struct monster_friends *friends;
	struct monster_friends_base *friends_base;
	int total;

	assert(c);
	assert(race);

	/* If we don't have a group index already, make one; our first monster
	 * will be the leader */
	if (!group_info.index) {
		group_info.index = monster_group_index_new(c);
	}

	/* Place one monster, or fail */
	if (!place_new_monster_one(c, grid, race, sleep, group_info, origin)) {
		return (false);
	}

	/* We're done unless the group flag is set */
	if (!group_ok) return (true);

	/* Go through friends flags */
	for (friends = race->friends; friends; friends = friends->next) {
		if ((unsigned int)randint0(100) >= friends->percent_chance)
			continue;

		/* Calculate the base number of monsters to place */
		total = damroll(friends->number_dice, friends->number_side);

		/* Set group role */
		group_info.role = friends->role;

		/* Place them */
		place_friends(c, grid, race, friends->race, total, sleep, group_info,
					  origin);

	}

	/* Go through the friends_base flags */
	for (friends_base = race->friends_base; friends_base;
			friends_base = friends_base->next){
		struct monster_race *friends_race;

		/* Check if we pass chance for the monster appearing */
		if ((unsigned int)randint0(100) >= friends_base->percent_chance)
			continue;

		total = damroll(friends_base->number_dice, friends_base->number_side);

		/* Set the escort index base*/
		place_monster_base = friends_base->base;

		/* Prepare allocation table */
		get_mon_num_prep(place_monster_base_okay);

		/* Pick a random race */
		friends_race = get_mon_num(race->level, c->depth);

		/* Reset allocation table */
		get_mon_num_prep(NULL);

		/* Handle failure */
		if (!friends_race) break;

		/* Set group role */
		group_info.role = friends_base->role;

		/* Place them */
		place_friends(c, grid, race, friends_race, total, sleep, group_info,
					  origin);
	}

	/* Success */
	return (true);
}